

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.cpp
# Opt level: O0

OpenMPClause *
OpenMPBindClause::addBindClause(OpenMPDirective *directive,OpenMPBindClauseBinding bind_binding)

{
  OpenMPDirectiveKind OVar1;
  size_type sVar2;
  OpenMPBindClause *this;
  OpenMPClause *pOVar3;
  mapped_type *ppvVar4;
  ostream *poVar5;
  key_type local_40 [4];
  OpenMPBindClause *local_30;
  OpenMPClause *new_clause;
  vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *current_clauses;
  map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
  *all_clauses;
  OpenMPDirective *pOStack_10;
  OpenMPBindClauseBinding bind_binding_local;
  OpenMPDirective *directive_local;
  
  all_clauses._4_4_ = bind_binding;
  pOStack_10 = directive;
  current_clauses =
       (vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)
       OpenMPDirective::getAllClauses(directive);
  new_clause = (OpenMPClause *)OpenMPDirective::getClauses(pOStack_10,OMPC_bind);
  local_30 = (OpenMPBindClause *)0x0;
  sVar2 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::size
                    ((vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)new_clause);
  if (sVar2 == 0) {
    this = (OpenMPBindClause *)operator_new(0x70);
    OpenMPBindClause(this,all_clauses._4_4_);
    local_30 = this;
    pOVar3 = (OpenMPClause *)operator_new(0x18);
    memset(pOVar3,0,0x18);
    std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::vector
              ((vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)pOVar3);
    new_clause = pOVar3;
    std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::push_back
              ((vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)pOVar3,
               (value_type *)&local_30);
    pOVar3 = new_clause;
    local_40[0] = OMPC_bind;
    ppvVar4 = std::
              map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
              ::operator[]((map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
                            *)current_clauses,local_40);
    *ppvVar4 = (mapped_type)pOVar3;
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Cannot have two bind clause for the directive ")
    ;
    OVar1 = OpenMPDirective::getKind(pOStack_10);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,OVar1);
    std::operator<<(poVar5,", ignored\n");
  }
  return &local_30->super_OpenMPClause;
}

Assistant:

OpenMPClause* OpenMPBindClause::addBindClause(OpenMPDirective *directive, OpenMPBindClauseBinding bind_binding) {

    std::map<OpenMPClauseKind, std::vector<OpenMPClause*>* >* all_clauses = directive->getAllClauses();
    std::vector<OpenMPClause*>* current_clauses = directive->getClauses(OMPC_bind);
    OpenMPClause* new_clause = NULL;

    if (current_clauses->size() == 0) {
        new_clause = new OpenMPBindClause(bind_binding);
        current_clauses = new std::vector<OpenMPClause*>();
        current_clauses->push_back(new_clause);
        (*all_clauses)[OMPC_bind] = current_clauses;
    } else { /* could be an error since if clause may only appear once */
        std::cerr << "Cannot have two bind clause for the directive " << directive->getKind() << ", ignored\n";
    };

    return new_clause;
}